

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parse_device(dev_t *pdev,archive *a,char *val)

{
  char *pcVar1;
  pack_t *ppVar2;
  u_long uVar3;
  char **sp;
  int iVar4;
  char *in_RDX;
  archive *in_RSI;
  dev_t *in_RDI;
  char *error;
  dev_t result;
  pack_t *pack;
  int argc;
  char *dev;
  char *p;
  unsigned_long numbers [3];
  char **p_00;
  dev_t local_60;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar5;
  u_long local_38 [3];
  char *local_20;
  archive *local_18;
  dev_t *local_10;
  int local_4;
  
  p_00 = (char **)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(in_RDI,0,8);
  pcVar1 = strchr(local_20,0x2c);
  if (pcVar1 == (char *)0x0) {
    local_60 = mtree_atol(p_00);
LAB_00159808:
    *local_10 = local_60;
    local_4 = 0;
  }
  else {
    sp = (char **)(pcVar1 + 1);
    *pcVar1 = '\0';
    ppVar2 = pack_find((char *)p_00);
    if (ppVar2 == (pack_t *)0x0) {
      archive_set_error(local_18,0x54,"Unknown format `%s\'",local_20);
      local_4 = -0x14;
    }
    else {
      iVar5 = 0;
      do {
        pcVar1 = la_strsep(sp,(char *)CONCAT44(iVar5,in_stack_ffffffffffffffb0));
        if (pcVar1 == (char *)0x0) {
          if (iVar5 < 2) {
            archive_set_error(local_18,0x54,"Not enough arguments");
            return -0x14;
          }
          local_60 = (*ppVar2)(iVar5,local_38,(char **)&stack0xffffffffffffff98);
          if (p_00 != (char **)0x0) {
            archive_set_error(local_18,0x54,"%s",p_00);
            return -0x14;
          }
          goto LAB_00159808;
        }
        if (*pcVar1 == '\0') {
          archive_set_error(local_18,0x54,"Missing number");
          return -0x14;
        }
        uVar3 = mtree_atol(p_00);
        iVar4 = iVar5 + 1;
        local_38[iVar5] = uVar3;
        iVar5 = iVar4;
      } while (iVar4 < 4);
      archive_set_error(local_18,0x54,"Too many arguments");
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = mtree_atol(&p);
			if (argc > MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}